

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O3

bool __thiscall VMState::InitVar(VMState *this,int pos,ExpressionPtr *exp,bool foreachInit)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined8 *puVar3;
  pointer pSVar4;
  int64_t startAddress;
  int64_t endAddress;
  pointer pcVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  int iVar7;
  NutFunction *pNVar8;
  LocalVarInitStatement *this_00;
  LocalVariableExpression *pLVar9;
  Error *this_01;
  long lVar10;
  size_t __n;
  ulong stackAddress;
  pointer name;
  ExpressionPtr local_70;
  ExpressionPtr *local_60;
  StatementPtr local_58;
  LocalVariableExpression *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  if ((pos < 0) ||
     ((int)((ulong)((long)(this->m_Stack).
                          super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(this->m_Stack).
                         super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x33333333 <= pos)) {
    this_01 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_01,"Accessing non valid stack position.");
    __cxa_throw(this_01,&Error::typeinfo,Error::~Error);
  }
  peVar1 = (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  if ((peVar1 != (element_type *)0x0) && (iVar7 = (**peVar1->_vptr_Expression)(), iVar7 == 2)) {
    p_Var2 = (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
    (exp->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  pNVar8 = this->m_Parent;
  name = (pNVar8->m_Locals).
         super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>.
         _M_impl.super__Vector_impl_data._M_start;
  if (name != (pNVar8->m_Locals).
              super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish) {
    stackAddress = (ulong)(uint)pos;
    local_60 = exp;
    do {
      if ((name->pos == stackAddress) && (name->foreachLoopState == foreachInit)) {
        lVar10 = (long)this->m_IP;
        if ((name->start_op == lVar10) ||
           ((name->start_op <= lVar10 && foreachInit && (lVar10 <= name->end_op)))) {
          puVar3 = &((this->m_Stack).
                     super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                     ._M_impl.super__Vector_impl_data._M_start[stackAddress].expression.
                     super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    _vptr_Expression;
          if ((puVar3 != (undefined8 *)0x0) && (iVar7 = (**(code **)*puVar3)(), iVar7 == 4)) {
            pSVar4 = (this->m_Stack).
                     super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            lVar10 = (long)pSVar4[stackAddress].expression.
                           super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var2 = pSVar4[stackAddress].expression.
                     super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            if (p_Var2 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              __n = *(size_t *)(lVar10 + 0x10);
              if (__n == (name->name)._M_string_length) {
                if (__n == 0) {
                  return false;
                }
                goto LAB_00111c08;
              }
            }
            else {
              if (__libc_single_threaded == '\0') {
                LOCK();
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
                UNLOCK();
              }
              else {
                p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
              }
              __n = *(size_t *)(lVar10 + 0x10);
              if (__n == (name->name)._M_string_length) {
                if (__n == 0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
                  return false;
                }
LAB_00111c08:
                iVar7 = bcmp(*(void **)(lVar10 + 8),(name->name)._M_dataplus._M_p,__n);
                if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
                }
                if (iVar7 == 0) {
                  return false;
                }
              }
              else {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
              }
            }
          }
          if (((name->end_op <= (long)(this->m_BlockState).blockEnd) ||
              ((this->m_BlockState).inLoop != '\0')) || ((this->m_BlockState).inSwitch != '\0')) {
            if (!foreachInit) {
              this_00 = (LocalVarInitStatement *)operator_new(0x60);
              startAddress = name->start_op;
              endAddress = name->end_op;
              local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (local_60->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                   = (local_60->super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>).
                     _M_refcount._M_pi;
              if (local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                if (__libc_single_threaded == '\0') {
                  LOCK();
                  (local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                  UNLOCK();
                }
                else {
                  (local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi)->_M_use_count =
                       (local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
                }
              }
              LocalVarInitStatement::LocalVarInitStatement
                        (this_00,&name->name,stackAddress,startAddress,endAddress,&local_70);
              std::__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2>::
              __shared_ptr<LocalVarInitStatement,void>
                        ((__shared_ptr<Statement,(__gnu_cxx::_Lock_policy)2> *)&local_58,this_00);
              PushStatement(this,&local_58);
              if (local_58.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_58.super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
              if (local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          (local_70.super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi);
              }
            }
            pLVar9 = (LocalVariableExpression *)operator_new(0x28);
            (pLVar9->super_VariableExpression).super_Expression._vptr_Expression =
                 (_func_int **)&PTR_GetType_0012b898;
            (pLVar9->super_VariableExpression).m_name._M_dataplus._M_p =
                 (pointer)&(pLVar9->super_VariableExpression).m_name.field_2;
            pcVar5 = (name->name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&(pLVar9->super_VariableExpression).m_name,pcVar5,
                       pcVar5 + (name->name)._M_string_length);
            (pLVar9->super_VariableExpression).super_Expression._vptr_Expression =
                 (_func_int **)&PTR_GetType_0012bf88;
            local_48 = pLVar9;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<LocalVariableExpression*>(a_Stack_40,pLVar9);
            _Var6._M_pi = a_Stack_40[0]._M_pi;
            pLVar9 = local_48;
            pSVar4 = (this->m_Stack).
                     super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            local_48 = (LocalVariableExpression *)0x0;
            a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            p_Var2 = pSVar4[stackAddress].expression.
                     super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            pSVar4 = pSVar4 + stackAddress;
            (pSVar4->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)pLVar9;
            (pSVar4->expression).super___shared_ptr<Expression,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = _Var6._M_pi;
            if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
            }
            if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
            }
            std::vector<std::shared_ptr<Statement>,_std::allocator<std::shared_ptr<Statement>_>_>::
            clear(&(this->m_Stack).
                   super__Vector_base<VMState::StackElement,_std::allocator<VMState::StackElement>_>
                   ._M_impl.super__Vector_impl_data._M_start[stackAddress].pendingStatements);
            return true;
          }
          pNVar8 = this->m_Parent;
        }
      }
      name = name + 1;
    } while (name != (pNVar8->m_Locals).
                     super__Vector_base<NutFunction::LocalVarInfo,_std::allocator<NutFunction::LocalVarInfo>_>
                     ._M_impl.super__Vector_impl_data._M_finish);
  }
  return false;
}

Assistant:

bool InitVar( int pos, ExpressionPtr exp = ExpressionPtr(), bool foreachInit = false )
	{
		if (pos < 0 || pos >= (int)m_Stack.size())
			throw Error("Accessing non valid stack position.");

		if (exp && exp->GetType() == Exp_Null)
			exp = ExpressionPtr();

		// Check for local initialization
		for( vector<NutFunction::LocalVarInfo>::const_iterator i = m_Parent.m_Locals.begin(); i != m_Parent.m_Locals.end(); ++i)
		{
			// Variable stack address
			if (i->pos != pos) continue;

			// Match foreach state variables
			if (i->foreachLoopState != foreachInit) continue;

			// Variable scope range
			if (m_IP != i->start_op && (!foreachInit || m_IP < i->start_op || m_IP > i->end_op)) continue;

			if (m_Stack[pos].expression && m_Stack[pos].expression->GetType() == Exp_LocalVariable 
				&& static_pointer_cast<LocalVariableExpression>(m_Stack[pos].expression)->GetVariableName() == i->name)
			{
				// This variable is already initialized
				break;
			}

			if (i->end_op > m_BlockState.blockEnd && m_BlockState.inLoop == 0 && m_BlockState.inSwitch == 0)
			{
				// Initialization of variable that reaches out of current if block - ignore
				continue;
			}

			// This is local initialization
			if (!foreachInit)
			{
				PushStatement(StatementPtr(new LocalVarInitStatement(i->name, pos, i->start_op, i->end_op, exp)));
			}

			m_Stack[pos].expression = ExpressionPtr(new LocalVariableExpression(i->name));
			m_Stack[pos].pendingStatements.clear();

			return true;
		}

		return false;
	}